

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void setalias(char *name,tagval *v)

{
  bool bVar1;
  char *n;
  ident local_60;
  ident *local_20;
  ident *id;
  tagval *v_local;
  char *name_local;
  
  id = (ident *)v;
  v_local = (tagval *)name;
  local_20 = hashset<ident>::access<char_const*>(&idents,(char **)&v_local);
  if (local_20 == (ident *)0x0) {
    bVar1 = checknumber((char *)v_local);
    if (bVar1) {
      debugcode("cannot alias number %s",v_local);
      freearg((tagval *)id);
    }
    else {
      n = newstring((char *)v_local);
      ident::ident(&local_60,4,n,(tagval *)id,identflags);
      addident(&local_60);
    }
  }
  else if (local_20->type == 4) {
    if (local_20->index < 0x19) {
      setarg(local_20,(tagval *)id);
    }
    else {
      setalias(local_20,(tagval *)id);
    }
  }
  else {
    debugcode("cannot redefine builtin %s with an alias",local_20->name);
    freearg((tagval *)id);
  }
  return;
}

Assistant:

static void setalias(const char *name, tagval &v)
{
    ident *id = idents.access(name);
    if(id)
    {
        if(id->type == ID_ALIAS)
        {
            if(id->index < MAXARGS) setarg(*id, v); else setalias(*id, v);
        }
        else
        {
            debugcode("cannot redefine builtin %s with an alias", id->name);
            freearg(v);
        }
    }
    else if(checknumber(name))
    {
        debugcode("cannot alias number %s", name);
        freearg(v);
    }
    else
    {
        addident(ident(ID_ALIAS, newstring(name), v, identflags));
    }
}